

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void av1_dr_prediction_z3_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  int in_ECX;
  int in_EDX;
  uint8_t *in_stack_00000058;
  int in_stack_000000a0;
  int in_stack_000000a4;
  uint8_t *in_stack_000000a8;
  ptrdiff_t in_stack_000000b0;
  uint8_t *in_stack_000000b8;
  int in_stack_000000e0;
  int in_stack_000000e4;
  uint8_t *in_stack_000000e8;
  ptrdiff_t in_stack_000000f0;
  uint8_t *in_stack_000000f8;
  int in_stack_00000100;
  int in_stack_00000104;
  uint8_t *in_stack_00000108;
  ptrdiff_t in_stack_00000110;
  uint8_t *in_stack_00000118;
  int in_stack_00000120;
  int in_stack_00000124;
  uint8_t *in_stack_00000128;
  ptrdiff_t in_stack_00000130;
  uint8_t *in_stack_00000138;
  int in_stack_000001c0;
  int in_stack_000001c4;
  uint8_t *in_stack_000001c8;
  ptrdiff_t in_stack_000001d0;
  uint8_t *in_stack_000001d8;
  int in_stack_00000230;
  int in_stack_00000234;
  uint8_t *in_stack_00000238;
  ptrdiff_t in_stack_00000240;
  uint8_t *in_stack_00000248;
  int in_stack_000002a0;
  int in_stack_000002a4;
  uint8_t *in_stack_000002a8;
  ptrdiff_t in_stack_000002b0;
  uint8_t *in_stack_000002b8;
  int in_stack_000002c0;
  int in_stack_000002c4;
  uint8_t *in_stack_000002c8;
  ptrdiff_t in_stack_000002d0;
  uint8_t *in_stack_000002d8;
  int in_stack_000003a8;
  int in_stack_000003ac;
  uint8_t *in_stack_000003b0;
  ptrdiff_t in_stack_000003b8;
  int in_stack_000003c0;
  int in_stack_000003c4;
  uint8_t *in_stack_000003c8;
  ptrdiff_t in_stack_000003d0;
  uint8_t *in_stack_000003d8;
  int in_stack_00000400;
  int in_stack_00000404;
  uint8_t *in_stack_00000408;
  ptrdiff_t in_stack_00000410;
  uint8_t *in_stack_00000418;
  int in_stack_000004c0;
  int in_stack_000004c4;
  uint8_t *in_stack_000004c8;
  ptrdiff_t in_stack_000004d0;
  uint8_t *in_stack_000004d8;
  int in_stack_000007a8;
  int in_stack_000007ac;
  uint8_t *in_stack_000007b0;
  ptrdiff_t in_stack_000007b8;
  int in_stack_000007c0;
  int in_stack_000007c4;
  uint8_t *in_stack_000007c8;
  ptrdiff_t in_stack_000007d0;
  uint8_t *in_stack_000007d8;
  int in_stack_00000fa8;
  int in_stack_00000fac;
  uint8_t *in_stack_00000fb0;
  ptrdiff_t in_stack_00000fb8;
  uint8_t *in_stack_00000fc0;
  
  if (in_EDX == in_ECX) {
    if (in_EDX == 4) {
      dr_prediction_z3_4x4_avx2(in_stack_00000058,(ptrdiff_t)dst,(uint8_t *)stride,bw,bh);
    }
    else if (in_EDX == 8) {
      dr_prediction_z3_8x8_avx2
                (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,
                 in_stack_000000e0);
    }
    else if (in_EDX == 0x10) {
      dr_prediction_z3_16x16_avx2
                (in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,in_stack_000001c4,
                 in_stack_000001c0);
    }
    else if (in_EDX == 0x20) {
      dr_prediction_z3_32x32_avx2
                (in_stack_000007d8,in_stack_000007d0,in_stack_000007c8,in_stack_000007c4,
                 in_stack_000007c0);
    }
    else if (in_EDX == 0x40) {
      dr_prediction_z3_64x64_avx2
                (in_stack_00000fc0,in_stack_00000fb8,in_stack_00000fb0,in_stack_00000fac,
                 in_stack_00000fa8);
    }
  }
  else if (in_EDX < in_ECX) {
    if (in_EDX * 2 == in_ECX) {
      switch(in_EDX) {
      case 4:
        dr_prediction_z3_4x8_avx2
                  (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,
                   in_stack_000000a0);
        break;
      case 8:
        dr_prediction_z3_8x16_avx2
                  (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000124,
                   in_stack_00000120);
        break;
      case 0x10:
        dr_prediction_z3_16x32_avx2
                  (in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,in_stack_000003c4,
                   in_stack_000003c0);
        break;
      case 0x20:
        dr_prediction_z3_32x64_avx2
                  ((uint8_t *)CONCAT44(in_stack_000007c4,in_stack_000007c0),in_stack_000007b8,
                   in_stack_000007b0,in_stack_000007ac,in_stack_000007a8);
      }
    }
    else if (in_EDX == 4) {
      dr_prediction_z3_4x16_avx2
                (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000104,
                 in_stack_00000100);
    }
    else if (in_EDX == 8) {
      dr_prediction_z3_8x32_avx2
                (in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,in_stack_000003c4,
                 in_stack_000003c0);
    }
    else if (in_EDX == 0x10) {
      dr_prediction_z3_16x64_avx2
                ((uint8_t *)CONCAT44(in_stack_000003c4,in_stack_000003c0),in_stack_000003b8,
                 in_stack_000003b0,in_stack_000003ac,in_stack_000003a8);
    }
  }
  else if (in_ECX * 2 == in_EDX) {
    switch(in_ECX) {
    case 4:
      dr_prediction_z3_8x4_avx2
                (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,
                 in_stack_000000a0);
      break;
    case 8:
      dr_prediction_z3_16x8_avx2
                (in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,in_stack_000002a4,
                 in_stack_000002a0);
      break;
    case 0x10:
      dr_prediction_z3_32x16_avx2
                (in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,in_stack_000002c4,
                 in_stack_000002c0);
      break;
    case 0x20:
      dr_prediction_z3_64x32_avx2
                ((uint8_t *)CONCAT44(in_stack_000007c4,in_stack_000007c0),in_stack_000007b8,
                 in_stack_000007b0,in_stack_000007ac,in_stack_000007a8);
    }
  }
  else if (in_ECX == 4) {
    dr_prediction_z3_16x4_avx2
              (in_stack_00000248,in_stack_00000240,in_stack_00000238,in_stack_00000234,
               in_stack_00000230);
  }
  else if (in_ECX == 8) {
    dr_prediction_z3_32x8_avx2
              (in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000404,
               in_stack_00000400);
  }
  else if (in_ECX == 0x10) {
    dr_prediction_z3_64x16_avx2
              (in_stack_000004d8,in_stack_000004d0,in_stack_000004c8,in_stack_000004c4,
               in_stack_000004c0);
  }
  return;
}

Assistant:

void av1_dr_prediction_z3_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_left, int dx, int dy) {
  (void)above;
  (void)dx;
  assert(dx == 1);
  assert(dy > 0);

  if (bw == bh) {
    switch (bw) {
      case 4:
        dr_prediction_z3_4x4_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 8:
        dr_prediction_z3_8x8_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 16:
        dr_prediction_z3_16x16_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 32:
        dr_prediction_z3_32x32_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 64:
        dr_prediction_z3_64x64_avx2(dst, stride, left, upsample_left, dy);
        break;
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            dr_prediction_z3_4x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x32_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_32x64_avx2(dst, stride, left, upsample_left, dy);
            break;
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_4x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x32_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x64_avx2(dst, stride, left, upsample_left, dy);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            dr_prediction_z3_8x4_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_16x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_32x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_64x32_avx2(dst, stride, left, upsample_left, dy);
            break;
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_16x4_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_32x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_64x16_avx2(dst, stride, left, upsample_left, dy);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
}